

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_entityrelationtask.cc
# Opt level: O0

bool EntityRelationTask::check_constraints(size_t ent1_id,size_t ent2_id,size_t rel_id)

{
  long in_RDX;
  long in_RSI;
  long in_RDI;
  size_t valid_ent2_id [5];
  size_t valid_ent1_id [5];
  long local_78 [6];
  long local_48 [6];
  long local_18;
  long local_10;
  bool local_1;
  
  local_48[5] = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  memset(local_48,0,0x28);
  local_48[0] = 2;
  local_48[1] = 3;
  local_48[2] = 4;
  local_48[3] = 2;
  local_48[4] = 2;
  memset(local_78,0,0x28);
  local_78[0] = 4;
  local_78[1] = 4;
  local_78[2] = 4;
  local_78[3] = 3;
  local_78[4] = 2;
  if (local_48[5] == 10) {
    local_1 = true;
  }
  else if ((local_48[local_48[5] + -5] == local_10) && (local_78[local_48[5] + -5] == local_18)) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool check_constraints(size_t ent1_id, size_t ent2_id, size_t rel_id)
{
  size_t valid_ent1_id[] = {2, 3, 4, 2, 2};  // encode the valid entity-relation combinations
  size_t valid_ent2_id[] = {4, 4, 4, 3, 2};
  if (rel_id - 5 == 5)
    return true;
  if (valid_ent1_id[rel_id - 5] == ent1_id && valid_ent2_id[rel_id - 5] == ent2_id)
    return true;
  return false;
}